

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void number_suite::value_int16(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_25c;
  value local_258;
  undefined1 local_253;
  undefined1 local_252 [2];
  undefined8 local_250;
  type_conflict4 local_248;
  undefined4 local_23c;
  type_conflict3 local_238 [2];
  undefined8 local_230;
  type_conflict local_228;
  undefined4 local_21c;
  type local_218 [2];
  undefined4 local_210;
  type_conflict2 local_20c [22];
  error *ex_6;
  error *ex_5;
  error *ex_4;
  error *ex_3;
  error *ex_2;
  error *ex_1;
  error *ex;
  value local_b8 [2];
  undefined4 local_b0;
  value local_ac [6];
  undefined4 local_94;
  value local_90 [2];
  undefined1 local_88 [8];
  reader reader;
  value_type input [3];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 1;
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0xb2;
  trial::protocol::bintoken::reader::reader<unsigned_char[3]>
            ((reader *)local_88,
             (uchar (*) [3])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x1c));
  local_90[0] = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_94 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x14f,"void number_suite::value_int16()",local_90,&local_94);
  local_ac[0] = trial::protocol::bintoken::reader::symbol((reader *)local_88);
  local_b0 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x150,"void number_suite::value_int16()",local_ac,&local_b0);
  local_b8[0] = trial::protocol::bintoken::reader::category((reader *)local_88);
  ex._4_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x151,"void number_suite::value_int16()",local_b8,(long)&ex + 4);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x152,"void number_suite::value_int16()",sVar1 == 1);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::boolean>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::boolean>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x155,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int8>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x157,"void number_suite::value_int16()");
  ex_2._4_2_ = trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int16>
                         ((reader *)local_88);
  ex_2._0_4_ = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("reader.value<token::int16>()","0x100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x158,"void number_suite::value_int16()",(long)&ex_2 + 4,&ex_2);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int32>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x15a,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int64>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x15c,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float32>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x15e,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float64>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x160,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::value<signed_char>((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::int8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x163,"void number_suite::value_int16()");
  local_20c[0] = trial::protocol::bintoken::reader::value<short>((reader *)local_88);
  local_210 = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("reader.value<token::int16::type>()","0x100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x164,"void number_suite::value_int16()",local_20c,&local_210);
  local_218[0] = trial::protocol::bintoken::reader::value<int>((reader *)local_88);
  local_21c = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<token::int32::type>()","0x100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x165,"void number_suite::value_int16()",local_218,&local_21c);
  local_228 = trial::protocol::bintoken::reader::value<long>((reader *)local_88);
  local_230 = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64::type>()","UINT64_C(0x0100)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x166,"void number_suite::value_int16()",&local_228,&local_230);
  local_238[0] = trial::protocol::bintoken::reader::value<float>((reader *)local_88);
  local_23c = 0x43800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("reader.value<token::float32::type>()","256.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x167,"void number_suite::value_int16()",local_238,&local_23c);
  local_248 = trial::protocol::bintoken::reader::value<double>((reader *)local_88);
  local_250 = 0x4070000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<token::float64::type>()","256.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x168,"void number_suite::value_int16()",&local_248,&local_250);
  local_252[0] = trial::protocol::bintoken::reader::next((reader *)local_88);
  local_253 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x169,"void number_suite::value_int16()",local_252,&local_253);
  local_258 = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_25c = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x16a,"void number_suite::value_int16()",&local_258,&local_25c);
  trial::protocol::bintoken::reader::~reader((reader *)local_88,(UI *)ui,uis);
  return;
}

Assistant:

void value_int16()
{
    const value_type input[] = { token::code::int16, 0x00, 0x01 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::boolean>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int16>(), 0x100);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int64>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int16::type>(), 0x100);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int32::type>(), 0x100);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64::type>(), UINT64_C(0x0100));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float32::type>(), 256.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float64::type>(), 256.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}